

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error callProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  bool bVar1;
  XML_Error XVar2;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  XML_Error ret;
  _Bool enough;
  size_t available_buffer;
  size_t had_before;
  size_t have_now;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  if ((end == (char *)0x0) || (start == (char *)0x0)) {
    local_58 = 0;
  }
  else {
    local_58 = (long)end - (long)start;
  }
  if ((parser->m_reparseDeferralEnabled != '\0') && ((parser->m_parsingStatus).finalBuffer == '\0'))
  {
    if ((parser->m_bufferPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
      local_60 = 0;
    }
    else {
      local_60 = (long)parser->m_bufferPtr - (long)parser->m_buffer;
    }
    if (local_60 < 0x400) {
      local_68 = local_60;
    }
    else {
      local_68 = 0x400;
    }
    if ((parser->m_bufferLim == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
      local_70 = 0;
    }
    else {
      local_70 = (long)parser->m_bufferLim - (long)parser->m_bufferEnd;
    }
    bVar1 = true;
    if (local_58 < parser->m_partialTokenBytesBefore << 1) {
      bVar1 = local_70 + (local_60 - local_68) < (ulong)(long)parser->m_lastBufferRequestSize;
    }
    if (!bVar1) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
  }
  XVar2 = (*parser->m_processor)(parser,start,end,endPtr);
  if (XVar2 == XML_ERROR_NONE) {
    if (*endPtr == start) {
      parser->m_partialTokenBytesBefore = local_58;
    }
    else {
      parser->m_partialTokenBytesBefore = 0;
    }
  }
  return XVar2;
}

Assistant:

static enum XML_Error
callProcessor(XML_Parser parser, const char *start, const char *end,
              const char **endPtr) {
  const size_t have_now = EXPAT_SAFE_PTR_DIFF(end, start);

  if (parser->m_reparseDeferralEnabled
      && ! parser->m_parsingStatus.finalBuffer) {
    // Heuristic: don't try to parse a partial token again until the amount of
    // available data has increased significantly.
    const size_t had_before = parser->m_partialTokenBytesBefore;
    // ...but *do* try anyway if we're close to causing a reallocation.
    size_t available_buffer
        = EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
#if XML_CONTEXT_BYTES > 0
    available_buffer -= EXPAT_MIN(available_buffer, XML_CONTEXT_BYTES);
#endif
    available_buffer
        += EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd);
    // m_lastBufferRequestSize is never assigned a value < 0, so the cast is ok
    const bool enough
        = (have_now >= 2 * had_before)
          || ((size_t)parser->m_lastBufferRequestSize > available_buffer);

    if (! enough) {
      *endPtr = start; // callers may expect this to be set
      return XML_ERROR_NONE;
    }
  }
#if defined(XML_TESTING)
  g_bytesScanned += (unsigned)have_now;
#endif
  const enum XML_Error ret = parser->m_processor(parser, start, end, endPtr);
  if (ret == XML_ERROR_NONE) {
    // if we consumed nothing, remember what we had on this parse attempt.
    if (*endPtr == start) {
      parser->m_partialTokenBytesBefore = have_now;
    } else {
      parser->m_partialTokenBytesBefore = 0;
    }
  }
  return ret;
}